

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extrapolation.cc
# Opt level: O0

void __thiscall
tchecker::zg::local_extra_lu_plus_t::extrapolate
          (local_extra_lu_plus_t *this,db_t *dbm,clock_id_t dim,vloc_t *vloc)

{
  clock_id_t cVar1;
  element_type *peVar2;
  int *l;
  int *u;
  vloc_t *vloc_local;
  clock_id_t dim_local;
  db_t *dbm_local;
  local_extra_lu_plus_t *this_local;
  
  peVar2 = std::
           __shared_ptr_access<const_tchecker::clockbounds::local_lu_map_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_tchecker::clockbounds::local_lu_map_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&(this->super_local_lu_extrapolation_t)._clock_bounds);
  cVar1 = clockbounds::local_lu_map_t::clock_number(peVar2);
  if (dim == cVar1 + 1) {
    peVar2 = std::
             __shared_ptr_access<const_tchecker::clockbounds::local_lu_map_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_tchecker::clockbounds::local_lu_map_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&(this->super_local_lu_extrapolation_t)._clock_bounds);
    clockbounds::local_lu_map_t::bounds
              (peVar2,vloc,(this->super_local_lu_extrapolation_t)._l,
               (this->super_local_lu_extrapolation_t)._u);
    l = make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>::ptr
                  ((this->super_local_lu_extrapolation_t)._l);
    u = make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>::ptr
                  ((this->super_local_lu_extrapolation_t)._u);
    tchecker::dbm::extra_lu_plus(dbm,dim,l,u);
    return;
  }
  __assert_fail("dim == _clock_bounds->clock_number() + 1",
                "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/zg/extrapolation.cc"
                ,0x78,
                "virtual void tchecker::zg::local_extra_lu_plus_t::extrapolate(tchecker::dbm::db_t *, tchecker::clock_id_t, const tchecker::vloc_t &)"
               );
}

Assistant:

void local_extra_lu_plus_t::extrapolate(tchecker::dbm::db_t * dbm, tchecker::clock_id_t dim, tchecker::vloc_t const & vloc)
{
  assert(dim == _clock_bounds->clock_number() + 1);
  _clock_bounds->bounds(vloc, *_l, *_u);
  tchecker::dbm::extra_lu_plus(dbm, dim, _l->ptr(), _u->ptr());
}